

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_set.hxx
# Opt level: O2

iterator __thiscall
cmsys::hash_set<int,_cmsys::hash<int>,_std::equal_to<int>,_std::allocator<char>_>::begin
          (hash_set<int,_cmsys::hash<int>,_std::equal_to<int>,_std::allocator<char>_> *this)

{
  pointer pp_Var1;
  _Hashtable_node<int> *p_Var2;
  ulong uVar3;
  iterator iVar4;
  
  pp_Var1 = (this->_M_ht)._M_buckets.
            super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  do {
    if ((ulong)((long)(this->_M_ht)._M_buckets.
                      super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3) <= uVar3) {
      p_Var2 = (_Hashtable_node<int> *)0x0;
      break;
    }
    p_Var2 = pp_Var1[uVar3];
    uVar3 = uVar3 + 1;
  } while (p_Var2 == (_Hashtable_node<int> *)0x0);
  iVar4._M_ht = &this->_M_ht;
  iVar4._M_cur = p_Var2;
  return iVar4;
}

Assistant:

iterator begin() const { return _M_ht.begin(); }